

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::StructConstructorParams
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,StructDef *struct_def,
          string *prefix)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  IdlNamer *pIVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ppFVar4;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  stringstream out;
  _Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_250;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_250
             ,&(struct_def->fields).vec);
  if (prefix->_M_string_length == 0) {
    std::operator<<(local_1a8,"builder: FlatBufferBuilder");
  }
  pIVar2 = &this->namer_;
  for (ppFVar4 = local_250._M_impl.super__Vector_impl_data._M_start;
      ppFVar4 != local_250._M_impl.super__Vector_impl_data._M_finish; ppFVar4 = ppFVar4 + 1) {
    pFVar1 = *ppFVar4;
    if (((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (pFVar1->value).type.struct_def, struct_def_00->fixed == true)) {
      (*(pIVar2->super_Namer)._vptr_Namer[7])(&local_218,pIVar2,pFVar1);
      std::operator+(&local_1d8,&local_218,"_");
      std::operator+(&local_1f8,prefix,&local_1d8);
      StructConstructorParams(&local_238,this,struct_def_00,&local_1f8);
      std::operator<<(local_1a8,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      this_00 = &local_218;
    }
    else {
      poVar3 = std::operator<<(local_1a8,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      (*(pIVar2->super_Namer)._vptr_Namer[7])(&local_238,pIVar2,pFVar1);
      poVar3 = std::operator<<(poVar3,(string *)&local_238);
      poVar3 = std::operator<<(poVar3,": ");
      GenType_abi_cxx11_(&local_1f8,this,&(pFVar1->value).type);
      std::operator<<(poVar3,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      this_00 = &local_238;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::stringbuf::str();
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&local_250);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string StructConstructorParams(const StructDef &struct_def,
                                      const std::string &prefix = "") const {
    // builder: FlatBufferBuilder
    std::stringstream out;
    auto field_vec = struct_def.fields.vec;
    if (prefix.empty()) { out << "builder: FlatBufferBuilder"; }
    for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure
        // names don't clash, and to make it obvious these arguments are
        // constructing a nested struct, prefix the name with the field
        // name.
        out << StructConstructorParams(*field.value.type.struct_def,
                                       prefix + (namer_.Variable(field) + "_"));
      } else {
        out << ", " << prefix << namer_.Variable(field) << ": "
            << GenType(field.value.type);
      }
    }
    return out.str();
  }